

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

size_t __thiscall
CoreML::Specification::ReduceSumSquareLayerParams::ByteSizeLong(ReduceSumSquareLayerParams *this)

{
  size_t sVar1;
  ulong uVar2;
  long lVar3;
  size_t sVar4;
  
  sVar1 = google::protobuf::internal::WireFormatLite::Int64Size(&this->axes_);
  if (sVar1 == 0) {
    lVar3 = 0;
  }
  else {
    uVar2 = (long)(int)sVar1 | 1;
    lVar3 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    lVar3 = (ulong)((int)lVar3 * 9 + 0x49U >> 6) + 1;
  }
  (this->_axes_cached_byte_size_).super___atomic_base<int>._M_i = (int)sVar1;
  sVar4 = lVar3 + sVar1 + 2;
  if (this->keepdims_ == false) {
    sVar4 = lVar3 + sVar1;
  }
  sVar1 = sVar4 + 2;
  if (this->reduceall_ == false) {
    sVar1 = sVar4;
  }
  uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    sVar1 = sVar1 + *(long *)((uVar2 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar1;
  return sVar1;
}

Assistant:

size_t ReduceSumSquareLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ReduceSumSquareLayerParams)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated int64 axes = 1;
  {
    size_t data_size = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      Int64Size(this->axes_);
    if (data_size > 0) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
            static_cast<int32_t>(data_size));
    }
    int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(data_size);
    _axes_cached_byte_size_.store(cached_size,
                                    std::memory_order_relaxed);
    total_size += data_size;
  }

  // bool keepDims = 2;
  if (this->_internal_keepdims() != 0) {
    total_size += 1 + 1;
  }

  // bool reduceAll = 3;
  if (this->_internal_reduceall() != 0) {
    total_size += 1 + 1;
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}